

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> * __thiscall
Memory::
AllocateArray<Memory::Recycler,JsUtil::SimpleDictionaryEntry<unsigned_int,Js::IndexPropertyDescriptor>,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> *pSVar1;
  ulong uVar2;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pSVar1 = (SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> *)0x8;
  }
  else {
    uVar2 = 0;
    pSVar1 = (SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> *)
             new__<Memory::Recycler>
                       (-(ulong)(count >> 0x3b != 0) | count << 5,(Recycler *)this,
                        (offset_in_Recycler_to_subr)allocator);
    do {
      JsUtil::SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor>::
      SimpleDictionaryEntry
                ((SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> *)
                 (&(pSVar1->
                   super_DefaultHashedEntry<unsigned_int,_Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   ).super_KeyValueEntry<unsigned_int,_Js::IndexPropertyDescriptor>.
                   super_ValueEntry<Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>.value.
                   Attributes + uVar2));
      uVar2 = uVar2 + 0x20;
    } while (count << 5 != uVar2);
  }
  return pSVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}